

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

CBString * __thiscall Bstrlib::CBString::operator+=(CBString *this,uchar c)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar c_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf] = c;
  iVar1 = bconchar(&this->super_tagbstring,c);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"CBString::Failure in concatenate",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return this;
}

Assistant:

const CBString& CBString::operator += (unsigned char c) {
	if (BSTR_ERR == bconchar (this, (char) c)) {
		bstringThrow ("Failure in concatenate");
	}
	return *this;
}